

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_base.hpp
# Opt level: O0

decode_result __thiscall
jessilib::decode_codepoint_utf8<char>
          (jessilib *this,basic_string_view<char,_std::char_traits<char>_> in_string)

{
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  byte *pbVar4;
  decode_result dVar5;
  undefined1 local_28 [8];
  basic_string_view<char,_std::char_traits<char>_> in_string_local;
  decode_result result;
  
  in_string_local._M_len = in_string._M_len;
  in_string_local._M_str._0_4_ = 0;
  result.codepoint = L'\0';
  result._4_4_ = 0;
  local_28 = (undefined1  [8])this;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_28);
  if (!bVar1) {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_28);
    if (((int)*pvVar2 & 0x80U) == 0) {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_28);
      in_string_local._M_str._0_4_ = (uint)*pvVar2;
      result.codepoint = L'\x01';
      result._4_4_ = 0;
    }
    else {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_28);
      if ((1 < sVar3) &&
         (pbVar4 = (byte *)std::basic_string_view<char,_std::char_traits<char>_>::front
                                     ((basic_string_view<char,_std::char_traits<char>_> *)local_28),
         (*pbVar4 & 0x40) != 0)) {
        pbVar4 = (byte *)std::basic_string_view<char,_std::char_traits<char>_>::front
                                   ((basic_string_view<char,_std::char_traits<char>_> *)local_28);
        if ((*pbVar4 & 0x20) == 0) {
          pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)local_28,0);
          in_string_local._M_str._0_4_ = ((int)*pvVar2 & 0x1fU) << 6;
          pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)local_28,1);
          in_string_local._M_str._0_4_ = ((int)*pvVar2 & 0x3fU) + (uint)in_string_local._M_str;
          result.codepoint = L'\x02';
          result._4_4_ = 0;
        }
        else {
          sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_28);
          if (2 < sVar3) {
            pbVar4 = (byte *)std::basic_string_view<char,_std::char_traits<char>_>::front
                                       ((basic_string_view<char,_std::char_traits<char>_> *)local_28
                                       );
            if ((*pbVar4 & 0x10) == 0) {
              pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                 ((basic_string_view<char,_std::char_traits<char>_> *)local_28,0);
              in_string_local._M_str._0_4_ = ((int)*pvVar2 & 0xfU) << 0xc;
              pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                 ((basic_string_view<char,_std::char_traits<char>_> *)local_28,1);
              in_string_local._M_str._0_4_ =
                   ((int)*pvVar2 & 0x3fU) * 0x40 + (uint)in_string_local._M_str;
              pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                 ((basic_string_view<char,_std::char_traits<char>_> *)local_28,2);
              in_string_local._M_str._0_4_ = ((int)*pvVar2 & 0x3fU) + (uint)in_string_local._M_str;
              result.codepoint = L'\x03';
              result._4_4_ = 0;
            }
            else {
              sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                ((basic_string_view<char,_std::char_traits<char>_> *)local_28);
              if (3 < sVar3) {
                pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                   ((basic_string_view<char,_std::char_traits<char>_> *)local_28,0);
                in_string_local._M_str._0_4_ = ((int)*pvVar2 & 0xfU) << 0x12;
                pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                   ((basic_string_view<char,_std::char_traits<char>_> *)local_28,1);
                in_string_local._M_str._0_4_ =
                     ((int)*pvVar2 & 0x3fU) * 0x1000 + (uint)in_string_local._M_str;
                pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                   ((basic_string_view<char,_std::char_traits<char>_> *)local_28,2);
                in_string_local._M_str._0_4_ =
                     ((int)*pvVar2 & 0x3fU) * 0x40 + (uint)in_string_local._M_str;
                pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                   ((basic_string_view<char,_std::char_traits<char>_> *)local_28,3);
                in_string_local._M_str._0_4_ = ((int)*pvVar2 & 0x3fU) + (uint)in_string_local._M_str
                ;
                result.codepoint = L'\x04';
                result._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  dVar5._4_4_ = 0;
  dVar5.codepoint = (uint)in_string_local._M_str;
  dVar5.units = result._0_8_;
  return dVar5;
}

Assistant:

constexpr decode_result decode_codepoint_utf8(std::basic_string_view<CharT> in_string) {
	decode_result result{ 0, 0 };

	if (in_string.empty()) {
		return result;
	}

	if ((in_string.front() & 0x80) != 0) { // UTF-8 sequence{
		// Validity check
		if (in_string.size() < 2
			|| (in_string.front() & 0x40) == 0) {
			// This is an invalid 1 byte sequence
			return result;
		}

		// get codepoint value
		if ((in_string.front() & 0x20) != 0) {
			// This is a 3+ byte sequence
			if (in_string.size() < 3) {
				// Invalid sequence; too few characters available
				return result;
			}

			if ((in_string.front() & 0x10) != 0) {
				// This is a 4 byte sequence
				if (in_string.size() < 4) {
					// Invalid sequence; too few characters available
					return result;
				}

				result.codepoint = static_cast<char32_t>(in_string[0] & 0x0F) << 18;
				result.codepoint += static_cast<char32_t>(in_string[1] & 0x3F) << 12;
				result.codepoint += static_cast<char32_t>(in_string[2] & 0x3F) << 6;
				result.codepoint += static_cast<char32_t>(in_string[3] & 0x3F);
				result.units = 4;
				return result;
			}

			// this is a 3 byte sequence
			result.codepoint = static_cast<char32_t>(in_string[0] & 0x0F) << 12;
			result.codepoint += static_cast<char32_t>(in_string[1] & 0x3F) << 6;
			result.codepoint += static_cast<char32_t>(in_string[2] & 0x3F);
			result.units = 3;
			return result;
		}

		// This is a 2 byte sequence
		result.codepoint = static_cast<char32_t>(in_string[0] & 0x1F) << 6;
		result.codepoint += static_cast<char32_t>(in_string[1] & 0x3F);
		result.units = 2;
		return result;
	}

	// This is a valid 1 byte sequence
	result.codepoint = static_cast<char32_t>(in_string.front());
	result.units = 1;

	return result;
}